

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O1

void __thiscall CompilationContext::suppressWaring(CompilationContext *this,char *text_id)

{
  char **ppcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  char **ppcVar5;
  ulong uVar6;
  long *local_60;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar2 = strcmp(text_id,analyzer_messages[0].textId);
  if (iVar2 == 0) {
    suppressWaring(this,analyzer_messages[0].intId);
    return;
  }
  uVar6 = 0xffffffffffffffff;
  ppcVar1 = &analyzer_messages[1].textId;
  do {
    ppcVar5 = ppcVar1;
    if (uVar6 == 0x57) goto LAB_0010779c;
    iVar2 = strcmp(text_id,*ppcVar5);
    uVar6 = uVar6 + 1;
    ppcVar1 = ppcVar5 + 3;
  } while (iVar2 != 0);
  suppressWaring(this,((AnalyzerMessage *)(ppcVar5 + -1))->intId);
  if (0x57 < uVar6) {
LAB_0010779c:
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Cannot suppress warning, text id not found: ","");
    plVar3 = (long *)std::__cxx11::string::append((char *)local_40);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    error(this,0x1e,(char *)local_60,0,0);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

void CompilationContext::suppressWaring(const char * text_id)
{
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      suppressWaring(analyzer_messages[i].intId);
      return;
    }

  error(30, (string("Cannot suppress warning, text id not found: ") + text_id).c_str(), 0, 0);
}